

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nsh_line_buffer.cpp
# Opt level: O1

void __thiscall
NshLineBufferAppendChar_SuccessMaxChar_Test::~NshLineBufferAppendChar_SuccessMaxChar_Test
          (NshLineBufferAppendChar_SuccessMaxChar_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(NshLineBufferAppendChar, SuccessMaxChar)
{
    nsh_line_buffer_t line;
    nsh_line_buffer_reset(&line);

    for (unsigned int i = 0; i < NSH_LINE_BUFFER_SIZE - 1; i++) {
        ASSERT_EQ(nsh_line_buffer_append_char(&line, 'a'), NSH_STATUS_OK);
    }

    auto status = nsh_line_buffer_append_char(&line, 'z');

    ASSERT_EQ(status, NSH_STATUS_OK);
    ASSERT_EQ(line.size, NSH_LINE_BUFFER_SIZE);
    ASSERT_EQ(line.buffer[NSH_LINE_BUFFER_SIZE - 1], 'z');
}